

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsModelsLoader.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::LibraryKinematicsModelsLoader::LibraryKinematicsModelsLoader
          (LibraryKinematicsModelsLoader *this,IFilePartLoader *callingFilePartLoader)

{
  FilePartLoader *in_RDI;
  IFilePartLoader *in_stack_ffffffffffffffb8;
  JointsLoader *in_stack_ffffffffffffffc0;
  FormulasLoader *in_stack_ffffffffffffffd0;
  
  FilePartLoader::FilePartLoader
            ((FilePartLoader *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  FormulasLoader::FormulasLoader(in_stack_ffffffffffffffd0);
  (in_RDI->super_IFilePartLoader).super_ExtraDataLoader._vptr_ExtraDataLoader =
       (_func_int **)&PTR__LibraryKinematicsModelsLoader_00dbcf80;
  in_RDI[1].super_IFilePartLoader.super_ExtraDataLoader._vptr_ExtraDataLoader =
       (_func_int **)&PTR__LibraryKinematicsModelsLoader_00dbd140;
  JointsLoader::JointsLoader(in_stack_ffffffffffffffc0);
  TransformationLoader::TransformationLoader
            ((TransformationLoader *)&in_RDI[0xc].super_IFilePartLoader.mParserImpl);
  in_RDI[0xd].super_IFilePartLoader.mPartLoader = (IFilePartLoader *)0x0;
  in_RDI[0xd].super_IFilePartLoader.mParserImpl = (IParserImpl *)0x0;
  std::
  stack<COLLADASaxFWL::KinematicLink*,std::deque<COLLADASaxFWL::KinematicLink*,std::allocator<COLLADASaxFWL::KinematicLink*>>>
  ::
  stack<std::deque<COLLADASaxFWL::KinematicLink*,std::allocator<COLLADASaxFWL::KinematicLink*>>,void>
            ((stack<COLLADASaxFWL::KinematicLink_*,_std::deque<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>_>
              *)&in_RDI[0xd].mCallingFilePartLoader);
  in_RDI[0x10].super_IFilePartLoader.mPartLoader = (IFilePartLoader *)0x0;
  HelperLoaderBase::setHandlingFilePartLoader((HelperLoaderBase *)(in_RDI + 1),in_RDI);
  HelperLoaderBase::setHandlingFilePartLoader
            ((HelperLoaderBase *)&in_RDI[0xb].super_IFilePartLoader.mPartLoader,in_RDI);
  return;
}

Assistant:

LibraryKinematicsModelsLoader::LibraryKinematicsModelsLoader( IFilePartLoader* callingFilePartLoader )
		: FilePartLoader(callingFilePartLoader)
		, mCurrentKinematicsModel(0)
		, mCurrentJointInstance(0)
		, mCurrentAttachment(0)
	{
		FormulasLoader::setHandlingFilePartLoader(this);
		mJointsLoader.setHandlingFilePartLoader(this);
	}